

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O2

void EncodeFrameSBG(uchar *frame,int *pframelen,uchar mid,uchar mclass,uchar *payload,int len)

{
  uint16 uVar1;
  size_t __n;
  
  frame[0] = 0xff;
  frame[1] = 'Z';
  frame[2] = mid;
  frame[3] = mclass;
  frame[4] = (uchar)len;
  frame[5] = (uchar)((uint)len >> 8);
  __n = (size_t)len;
  memcpy(frame + 6,payload,__n);
  uVar1 = CalcCRCSBG(frame + 2,(short)len + 4);
  frame[__n + 6] = (uchar)uVar1;
  frame[__n + 7] = (uchar)(uVar1 >> 8);
  frame[__n + 8] = '3';
  *pframelen = len + 9;
  return;
}

Assistant:

inline void EncodeFrameSBG(unsigned char* frame, int* pframelen, unsigned char mid, unsigned char mclass, unsigned char* payload, int len)
{
	int offset = 0;
	uint16 crc = 0;

	frame[0] = (unsigned char)SYNC1_SBG;
	frame[1] = (unsigned char)SYNC2_SBG;
	frame[2] = (unsigned char)mid;
	frame[3] = (unsigned char)mclass;
	frame[4] = (unsigned char)(len&0xFF);
	frame[5] = (unsigned char)(len>>8);
	offset = FRAME_HEADER_LEN_SBG;
	memcpy(frame+offset, payload, len);
	offset += len;
	crc = CalcCRCSBG(frame+2, (uint16)(offset-2));
	frame[offset] = (unsigned char)(crc&0xFF);
	offset++;
	frame[offset] = (unsigned char)(crc>>8);
	offset++;
	frame[offset] = (unsigned char)ETX_SBG;
	*pframelen = len+MIN_FRAME_LEN_SBG;
}